

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O1

IterateResult __thiscall
gl4cts::DirectStateAccess::Framebuffers::DrawReadBuffersErrorsTest::iterate
          (DrawReadBuffersErrorsTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  int iVar25;
  ContextType ctxType;
  undefined4 extraout_var;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  long lVar26;
  
  iVar25 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar26 = CONCAT44(extraout_var,iVar25);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar1) || (bVar2)) {
    PrepareObjects(this);
    (**(code **)(lVar26 + 0xef0))(this->m_fbo_invalid,this->m_attachment_color);
    bVar1 = ExpectError(this,0x502,"NamedFramebufferDrawBuffer",
                        "framebuffer is not zero or the name of an existing framebuffer object.");
    (**(code **)(lVar26 + 0xef0))(this->m_fbo_valid,this->m_attachment_invalid);
    bVar2 = ExpectError(this,0x500,"NamedFramebufferDrawBuffer","buf is not an accepted value.");
    (**(code **)(lVar26 + 0xef0))(this->m_fbo_valid,this->m_attachment_back_left);
    bVar3 = ExpectError(this,0x502,"NamedFramebufferDrawBuffer",
                        "the GL is bound to a draw framebuffer object and the ith argument is a value other than COLOR_ATTACHMENTi or NONE."
                       );
    (**(code **)(lVar26 + 0xef8))(this->m_fbo_invalid,1);
    bVar4 = ExpectError(this,0x502,"NamedFramebufferDrawBuffers",
                        "framebuffer is not zero or the name of an existing framebuffer object.");
    (**(code **)(lVar26 + 0xef8))(this->m_fbo_valid,0xffffffff,&this->m_attachment_color);
    bVar5 = ExpectError(this,0x501,"NamedFramebufferDrawBuffers","n is less than 0.");
    (**(code **)(lVar26 + 0xef8))
              (this->m_fbo_valid,this->m_attachments_too_many_count,this->m_attachments_too_many);
    bVar6 = ExpectError(this,0x501,"NamedFramebufferDrawBuffers",
                        "n is greater than MAX_DRAW_BUFFERS.");
    (**(code **)(lVar26 + 0xef8))(this->m_fbo_valid,1,&this->m_attachment_invalid);
    bVar7 = ExpectError(this,0x500,"NamedFramebufferDrawBuffers",
                        "one of the values in bufs is not an accepted value.");
    (**(code **)(lVar26 + 0xef8))(this->m_fbo_valid,2,this->m_attachments_invalid);
    bVar8 = ExpectError(this,0x502,"NamedFramebufferDrawBuffers",
                        "a symbolic constant other than GL_NONE appears more than once in bufs.");
    (**(code **)(lVar26 + 0xef8))(this->m_fbo_valid,1);
    bVar9 = ExpectError(this,0x500,"NamedFramebufferDrawBuffers",
                        "a framebuffer object is tested and a value in bufs is FRONT.");
    (**(code **)(lVar26 + 0xef8))(this->m_fbo_valid,1,&this->m_attachment_left);
    bVar10 = ExpectError(this,0x500,"NamedFramebufferDrawBuffers",
                         "a framebuffer object is tested and a value in bufs is LEFT.");
    (**(code **)(lVar26 + 0xef8))(this->m_fbo_valid,1,&this->m_attachment_right);
    bVar11 = ExpectError(this,0x500,"NamedFramebufferDrawBuffers",
                         "a framebuffer object is tested and a value in bufs is RIGHT.");
    (**(code **)(lVar26 + 0xef8))(this->m_fbo_valid,1,&this->m_attachment_front_and_back);
    bVar12 = ExpectError(this,0x500,"NamedFramebufferDrawBuffers",
                         "a framebuffer object is tested and a value in bufs is FRONT_AND_BACK.");
    (**(code **)(lVar26 + 0xef8))(0,1,&this->m_attachment_front);
    bVar13 = ExpectError(this,0x500,"NamedFramebufferDrawBuffers",
                         "a default framebuffer is tested and a value in bufs is FRONT.");
    (**(code **)(lVar26 + 0xef8))(0,1,&this->m_attachment_left);
    bVar14 = ExpectError(this,0x500,"NamedFramebufferDrawBuffers",
                         "a default framebuffer is tested and a value in bufs is LEFT.");
    (**(code **)(lVar26 + 0xef8))(0,1,&this->m_attachment_right);
    bVar15 = ExpectError(this,0x500,"NamedFramebufferDrawBuffers",
                         "a default framebuffer is tested and a value in bufs is RIGHT.");
    (**(code **)(lVar26 + 0xef8))(0,1,&this->m_attachment_front_and_back);
    bVar16 = ExpectError(this,0x500,"NamedFramebufferDrawBuffers",
                         "a default framebuffer is tested and a value in bufs is FRONT_AND_BACK.");
    (**(code **)(lVar26 + 0xef8))(0,2,this->m_attachments_back_invalid);
    bVar17 = ExpectError(this,0x502,"NamedFramebufferDrawBuffers",
                         "any value in bufs is BACK, and n is not one.");
    (**(code **)(lVar26 + 0xef8))(this->m_fbo_valid,1,&this->m_attachment_back_left);
    bVar18 = ExpectError(this,0x502,"NamedFramebufferDrawBuffers",
                         "the API call refers to a framebuffer object and one or more of the values in bufs is anything other than NONE or one of the COLOR_ATTACHMENTn tokens."
                        );
    (**(code **)(lVar26 + 0xef8))(0,1,&this->m_attachment_color);
    bVar19 = ExpectError(this,0x502,"NamedFramebufferDrawBuffers",
                         "the API call refers to the default framebuffer and one or more of the values in bufs is one of the COLOR_ATTACHMENTn tokens."
                        );
    (**(code **)(lVar26 + 0xf08))(this->m_fbo_invalid,this->m_attachment_color);
    bVar20 = ExpectError(this,0x502,"NamedFramebufferReadBuffer",
                         "framebuffer is not zero or the name of an existing framebuffer object.");
    (**(code **)(lVar26 + 0xf08))(this->m_fbo_valid,this->m_attachment_invalid);
    bVar21 = ExpectError(this,0x500,"NamedFramebufferReadBuffer",
                         "src is not one of the accepted values (tables 17.4 and 17.5 of OpenGL 4.5 Core Profile Specification)."
                        );
    (**(code **)(lVar26 + 0xf08))(0,0x8ce0);
    bVar22 = ExpectError(this,0x502,"NamedFramebufferReadBuffer",
                         "the default framebuffer is affected and src is a value (other than NONE) that does not indicate any of the color buffers allocated to the default framebuffer."
                        );
    (**(code **)(lVar26 + 0xf08))(this->m_fbo_valid,this->m_attachment_front_and_back);
    bVar23 = ExpectError(this,0x502,"NamedFramebufferReadBuffer",
                         "a framebuffer object is affected, and src is one of the  constants from table 17.4."
                        );
    (**(code **)(lVar26 + 0xf08))(this->m_fbo_valid,this->m_max_color_attachments + 0x8ce0);
    bVar24 = ExpectError(this,0x502,"NamedFramebufferReadBuffer",
                         "a framebuffer object is affected, and src is one of the COLOR_ATTACHMENTm where mis greater than or equal to the value of MAX_COLOR_ATTACHMENTS."
                        );
    Clean(this);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (((((((((((((((((((((((bVar1 && bVar2) && bVar3) && bVar4) && bVar5) && bVar6) && bVar7) &&
                       bVar8) && bVar9) && bVar10) && bVar11) && bVar12) && bVar13) && bVar14) &&
                bVar15) && bVar16) && bVar17) && bVar18) && bVar19) && bVar20) && bVar21) && bVar22)
        && bVar23) && bVar24) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult DrawReadBuffersErrorsTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	try
	{
		/* Prepare objects. */
		PrepareObjects();

		/*  Check that INVALID_OPERATION error is generated by
		 NamedFramebufferDrawBuffer if framebuffer is not zero or the name of an
		 existing framebuffer object. */
		gl.namedFramebufferDrawBuffer(m_fbo_invalid, m_attachment_color);

		is_ok &= ExpectError(GL_INVALID_OPERATION, "NamedFramebufferDrawBuffer",
							 "framebuffer is not zero or the name of an existing framebuffer object.");

		/*  Check that INVALID_ENUM is generated by NamedFramebufferDrawBuffer if
		 buf is not an accepted value. */
		gl.namedFramebufferDrawBuffer(m_fbo_valid, m_attachment_invalid);

		is_ok &= ExpectError(GL_INVALID_ENUM, "NamedFramebufferDrawBuffer", "buf is not an accepted value.");

		/*  Check that INVALID_OPERATION is generated by NamedFramebufferDrawBuffer
		 if the GL is bound to a draw framebuffer object and the ith argument is
		 a value other than COLOR_ATTACHMENTi or NONE. */
		gl.namedFramebufferDrawBuffer(m_fbo_valid, m_attachment_back_left);

		is_ok &= ExpectError(GL_INVALID_OPERATION, "NamedFramebufferDrawBuffer",
							 "the GL is bound to a draw framebuffer object and the ith argument is a value other than "
							 "COLOR_ATTACHMENTi or NONE.");

		/*  Check that INVALID_OPERATION error is generated by
		 NamedFramebufferDrawBuffers if framebuffer is not zero or the name of an
		 existing framebuffer object. */
		gl.namedFramebufferDrawBuffers(m_fbo_invalid, 1, &m_attachment_color);

		is_ok &= ExpectError(GL_INVALID_OPERATION, "NamedFramebufferDrawBuffers",
							 "framebuffer is not zero or the name of an existing framebuffer object.");

		/*  Check that INVALID_VALUE is generated by NamedFramebufferDrawBuffers if n
		 is less than 0. */
		gl.namedFramebufferDrawBuffers(m_fbo_valid, -1, &m_attachment_color);

		is_ok &= ExpectError(GL_INVALID_VALUE, "NamedFramebufferDrawBuffers", "n is less than 0.");

		/*  Check that INVALID_VALUE is generated by NamedFramebufferDrawBuffers if
		 n is greater than MAX_DRAW_BUFFERS. */
		gl.namedFramebufferDrawBuffers(m_fbo_valid, m_attachments_too_many_count, m_attachments_too_many);

		is_ok &= ExpectError(GL_INVALID_VALUE, "NamedFramebufferDrawBuffers", "n is greater than MAX_DRAW_BUFFERS.");

		/*  Check that INVALID_ENUM is generated by NamedFramebufferDrawBuffers if
		 one of the values in bufs is not an accepted value. */
		gl.namedFramebufferDrawBuffers(m_fbo_valid, 1, &m_attachment_invalid);

		is_ok &= ExpectError(GL_INVALID_ENUM, "NamedFramebufferDrawBuffers",
							 "one of the values in bufs is not an accepted value.");

		/*  Check that INVALID_OPERATION is generated by NamedFramebufferDrawBuffers
		 if a symbolic constant other than GL_NONE appears more than once in
		 bufs. */
		gl.namedFramebufferDrawBuffers(m_fbo_valid, 2, m_attachments_invalid);

		is_ok &= ExpectError(GL_INVALID_OPERATION, "NamedFramebufferDrawBuffers",
							 "a symbolic constant other than GL_NONE appears more than once in bufs.");

		/*  Check that INVALID_ENUM error is generated by NamedFramebufferDrawBuffers if any value in bufs is FRONT, LEFT, RIGHT, or FRONT_AND_BACK.
		 This restriction applies to both the default framebuffer and framebuffer objects, and exists because these constants may themselves
		 refer to multiple buffers, as shown in table 17.4. */
		gl.namedFramebufferDrawBuffers(m_fbo_valid, 1, &m_attachment_front);

		is_ok &= ExpectError(GL_INVALID_ENUM, "NamedFramebufferDrawBuffers",
							 "a framebuffer object is tested and a value in bufs is FRONT.");

		gl.namedFramebufferDrawBuffers(m_fbo_valid, 1, &m_attachment_left);

		is_ok &= ExpectError(GL_INVALID_ENUM, "NamedFramebufferDrawBuffers",
							 "a framebuffer object is tested and a value in bufs is LEFT.");

		gl.namedFramebufferDrawBuffers(m_fbo_valid, 1, &m_attachment_right);

		is_ok &= ExpectError(GL_INVALID_ENUM, "NamedFramebufferDrawBuffers",
							 "a framebuffer object is tested and a value in bufs is RIGHT.");

		gl.namedFramebufferDrawBuffers(m_fbo_valid, 1, &m_attachment_front_and_back);

		is_ok &= ExpectError(GL_INVALID_ENUM, "NamedFramebufferDrawBuffers",
							 "a framebuffer object is tested and a value in bufs is FRONT_AND_BACK.");

		gl.namedFramebufferDrawBuffers(0, 1, &m_attachment_front);

		is_ok &= ExpectError(GL_INVALID_ENUM, "NamedFramebufferDrawBuffers",
							 "a default framebuffer is tested and a value in bufs is FRONT.");

		gl.namedFramebufferDrawBuffers(0, 1, &m_attachment_left);

		is_ok &= ExpectError(GL_INVALID_ENUM, "NamedFramebufferDrawBuffers",
							 "a default framebuffer is tested and a value in bufs is LEFT.");

		gl.namedFramebufferDrawBuffers(0, 1, &m_attachment_right);

		is_ok &= ExpectError(GL_INVALID_ENUM, "NamedFramebufferDrawBuffers",
							 "a default framebuffer is tested and a value in bufs is RIGHT.");

		gl.namedFramebufferDrawBuffers(0, 1, &m_attachment_front_and_back);

		is_ok &= ExpectError(GL_INVALID_ENUM, "NamedFramebufferDrawBuffers",
							 "a default framebuffer is tested and a value in bufs is FRONT_AND_BACK.");

		/*  Check that INVALID_OPERATION is generated by NamedFramebufferDrawBuffers
		 if any value in bufs is BACK, and n is not one. */
		gl.namedFramebufferDrawBuffers(0, 2, m_attachments_back_invalid);

		is_ok &= ExpectError(GL_INVALID_OPERATION, "NamedFramebufferDrawBuffers",
							 "any value in bufs is BACK, and n is not one.");

		/*  Check that INVALID_OPERATION is generated by NamedFramebufferDrawBuffers if
		 the API call refers to a framebuffer object and one or more of the
		 values in bufs is anything other than NONE or one of the
		 COLOR_ATTACHMENTn tokens. */
		gl.namedFramebufferDrawBuffers(m_fbo_valid, 1, &m_attachment_back_left);

		is_ok &= ExpectError(GL_INVALID_OPERATION, "NamedFramebufferDrawBuffers",
							 "the API call refers to a framebuffer object and one or more of the values in bufs is "
							 "anything other than NONE or one of the COLOR_ATTACHMENTn tokens.");

		/*  Check that INVALID_OPERATION is generated by NamedFramebufferDrawBuffers if
		 the API call refers to the default framebuffer and one or more of the
		 values in bufs is one of the COLOR_ATTACHMENTn tokens. */
		gl.namedFramebufferDrawBuffers(0, 1, &m_attachment_color);

		is_ok &= ExpectError(GL_INVALID_OPERATION, "NamedFramebufferDrawBuffers",
							 "the API call refers to the default framebuffer and one or more of the values in bufs is "
							 "one of the COLOR_ATTACHMENTn tokens.");

		/*  Check that INVALID_OPERATION is generated by NamedFramebufferReadBuffer
		 if framebuffer is not zero or the name of an existing framebuffer
		 object. */
		gl.namedFramebufferReadBuffer(m_fbo_invalid, m_attachment_color);

		is_ok &= ExpectError(GL_INVALID_OPERATION, "NamedFramebufferReadBuffer",
							 "framebuffer is not zero or the name of an existing framebuffer object.");

		/*  Check that INVALID_ENUM is generated by NamedFramebufferReadBuffer if
		 src is not one of the accepted values (tables 17.4 and 17.5 of OpenGL 4.5 Core Profile Specification). */
		gl.namedFramebufferReadBuffer(m_fbo_valid, m_attachment_invalid);

		is_ok &= ExpectError(
			GL_INVALID_ENUM, "NamedFramebufferReadBuffer",
			"src is not one of the accepted values (tables 17.4 and 17.5 of OpenGL 4.5 Core Profile Specification).");

		/* Check that INVALID_OPERATION error is generated by NamedFramebufferReadBuffer if the default framebuffer is
		 affected and src is a value (other than NONE) that does not indicate any of the
		 color buffers allocated to the default framebuffer. */
		gl.namedFramebufferReadBuffer(0, GL_COLOR_ATTACHMENT0);

		is_ok &= ExpectError(GL_INVALID_OPERATION, "NamedFramebufferReadBuffer",
							 "the default framebuffer is affected and src is a value (other than NONE) that does not "
							 "indicate any of the color buffers allocated to the default framebuffer.");

		/* Check that INVALID_OPERATION error is generated by NamedFramebufferReadBuffer if a framebuffer object is
		 affected, and src is one of the  constants from table 17.4 (other than NONE, or COLOR_ATTACHMENTm where m
		 is greater than or equal to the value of MAX_COLOR_ATTACHMENTS). */
		gl.namedFramebufferReadBuffer(m_fbo_valid, m_attachment_front_and_back);

		is_ok &= ExpectError(GL_INVALID_OPERATION, "NamedFramebufferReadBuffer",
							 "a framebuffer object is affected, and src is one of the  constants from table 17.4.");

		gl.namedFramebufferReadBuffer(m_fbo_valid, GL_COLOR_ATTACHMENT0 + m_max_color_attachments);

		is_ok &= ExpectError(GL_INVALID_OPERATION, "NamedFramebufferReadBuffer",
							 "a framebuffer object is affected, and src is one of the COLOR_ATTACHMENTm where mis "
							 "greater than or equal to the value of MAX_COLOR_ATTACHMENTS.");
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	Clean();

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}